

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2padded_cell.cc
# Opt level: O0

S2CellId __thiscall S2PaddedCell::ShrinkToFit(S2PaddedCell *this,R2Rect *rect)

{
  bool bVar1;
  int iVar2;
  R2Rect *pRVar3;
  ostream *poVar4;
  R1Interval *pRVar5;
  double *pdVar6;
  int *piVar7;
  uint *puVar8;
  S2CellId SVar9;
  long lVar10;
  double dVar11;
  S2CellId local_ac;
  S2CellId local_a4;
  int local_9c;
  uint32 local_98;
  int level;
  int level_msb;
  uint local_8c;
  int local_88;
  int ij_max;
  uint local_80;
  int d;
  int ij_xor [2];
  int ij_min [2];
  R2Rect padded;
  int ij_size;
  S2LogMessage local_38;
  S2LogMessageVoidify local_21;
  R2Rect *local_20;
  R2Rect *rect_local;
  S2PaddedCell *this_local;
  
  local_20 = rect;
  rect_local = (R2Rect *)this;
  pRVar3 = bound(this);
  bVar1 = R2Rect::Intersects(pRVar3,local_20);
  if (((bVar1 ^ 0xffU) & 1) != 0) {
    S2FatalLogMessage::S2FatalLogMessage
              ((S2FatalLogMessage *)&local_38,
               "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/s2padded_cell.cc"
               ,0x7b,kFatal,(ostream *)&std::cerr);
    poVar4 = S2LogMessage::stream(&local_38);
    poVar4 = std::operator<<(poVar4,"Check failed: bound().Intersects(rect) ");
    S2LogMessageVoidify::operator&(&local_21,poVar4);
    S2FatalLogMessage::~S2FatalLogMessage((S2FatalLogMessage *)&local_38);
  }
  iVar2 = S2CellId::GetSizeIJ(this->level_);
  if (this->level_ == 0) {
    pRVar5 = R2Rect::operator[](local_20,0);
    bVar1 = R1Interval::Contains(pRVar5,0.0);
    if (!bVar1) {
      pRVar5 = R2Rect::operator[](local_20,1);
      bVar1 = R1Interval::Contains(pRVar5,0.0);
      if (!bVar1) {
LAB_004b1ebb:
        pRVar3 = local_20;
        dVar11 = padding(this);
        R2Rect::Expanded((R2Rect *)ij_min,pRVar3,dVar11 + 3.3306690738754696e-16);
        for (ij_max = 0; ij_max < 2; ij_max = ij_max + 1) {
          lVar10 = (long)ij_max;
          pRVar5 = R2Rect::operator[]((R2Rect *)ij_min,ij_max);
          pdVar6 = R1Interval::operator[](pRVar5,0);
          dVar11 = S2::UVtoST(*pdVar6);
          local_88 = S2::STtoIJ(dVar11);
          piVar7 = std::max<int>(this->ij_lo_ + lVar10,&local_88);
          ij_xor[ij_max] = *piVar7;
          level_msb = this->ij_lo_[ij_max] + iVar2 + -1;
          pRVar5 = R2Rect::operator[]((R2Rect *)ij_min,ij_max);
          pdVar6 = R1Interval::operator[](pRVar5,1);
          dVar11 = S2::UVtoST(*pdVar6);
          level = S2::STtoIJ(dVar11);
          puVar8 = (uint *)std::min<int>(&level_msb,&level);
          local_8c = *puVar8;
          (&local_80)[ij_max] = ij_xor[ij_max] ^ local_8c;
        }
        local_98 = (local_80 | d) * 2 + 1;
        local_9c = Bits::FindMSBSetNonZero(local_98);
        local_9c = 0x1e - local_9c;
        if (local_9c <= this->level_) {
          SVar9 = id(this);
          return (S2CellId)SVar9.id_;
        }
        local_ac = id(this);
        iVar2 = S2CellId::face(&local_ac);
        local_a4 = S2CellId::FromFaceIJ(iVar2,ij_xor[0],ij_xor[1]);
        SVar9 = S2CellId::parent(&local_a4,local_9c);
        return (S2CellId)SVar9.id_;
      }
    }
    this_local = (S2PaddedCell *)id(this);
  }
  else {
    pRVar5 = R2Rect::operator[](local_20,0);
    dVar11 = S2::SiTitoST(this->ij_lo_[0] * 2 + iVar2);
    dVar11 = S2::STtoUV(dVar11);
    bVar1 = R1Interval::Contains(pRVar5,dVar11);
    if (!bVar1) {
      pRVar5 = R2Rect::operator[](local_20,1);
      dVar11 = S2::SiTitoST(this->ij_lo_[1] * 2 + iVar2);
      dVar11 = S2::STtoUV(dVar11);
      bVar1 = R1Interval::Contains(pRVar5,dVar11);
      if (!bVar1) goto LAB_004b1ebb;
    }
    this_local = (S2PaddedCell *)id(this);
  }
  return (S2CellId)(uint64)this_local;
}

Assistant:

S2CellId S2PaddedCell::ShrinkToFit(const R2Rect& rect) const {
  S2_DCHECK(bound().Intersects(rect));

  // Quick rejection test: if "rect" contains the center of this cell along
  // either axis, then no further shrinking is possible.
  int ij_size = S2CellId::GetSizeIJ(level_);
  if (level_ == 0) {
    // Fast path (most calls to this function start with a face cell).
    if (rect[0].Contains(0) || rect[1].Contains(0)) return id();
  } else {
    if (rect[0].Contains(S2::STtoUV(S2::SiTitoST(2 * ij_lo_[0] + ij_size))) ||
        rect[1].Contains(S2::STtoUV(S2::SiTitoST(2 * ij_lo_[1] + ij_size)))) {
      return id();
    }
  }
  // Otherwise we expand "rect" by the given padding() on all sides and find
  // the range of coordinates that it spans along the i- and j-axes.  We then
  // compute the highest bit position at which the min and max coordinates
  // differ.  This corresponds to the first cell level at which at least two
  // children intersect "rect".

  // Increase the padding to compensate for the error in S2::UVtoST().
  // (The constant below is a provable upper bound on the additional error.)
  R2Rect padded = rect.Expanded(padding() + 1.5 * DBL_EPSILON);
  int ij_min[2];  // Min i- or j- coordinate spanned by "padded"
  int ij_xor[2];  // XOR of the min and max i- or j-coordinates
  for (int d = 0; d < 2; ++d) {
    ij_min[d] = max(ij_lo_[d], S2::STtoIJ(S2::UVtoST(padded[d][0])));
    int ij_max = min(ij_lo_[d] + ij_size - 1,
                     S2::STtoIJ(S2::UVtoST(padded[d][1])));
    ij_xor[d] = ij_min[d] ^ ij_max;
  }
  // Compute the highest bit position where the two i- or j-endpoints differ,
  // and then choose the cell level that includes both of these endpoints.  So
  // if both pairs of endpoints are equal we choose kMaxLevel; if they differ
  // only at bit 0, we choose (kMaxLevel - 1), and so on.
  int level_msb = ((ij_xor[0] | ij_xor[1]) << 1) + 1;
  int level = S2CellId::kMaxLevel - Bits::FindMSBSetNonZero(level_msb);
  if (level <= level_) return id();
  return S2CellId::FromFaceIJ(id().face(), ij_min[0], ij_min[1]).parent(level);
}